

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateIntersectionId
          (ValidationState_t *_,Instruction *inst,uint32_t intersection_index)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t iVar3;
  DiagnosticStream *this;
  DiagnosticStream local_208;
  Op local_30;
  uint32_t local_2c;
  Op intersection_opcode;
  uint32_t intersection_type;
  uint32_t intersection_id;
  uint32_t intersection_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  intersection_type = intersection_index;
  _intersection_id = inst;
  inst_local = (Instruction *)_;
  intersection_opcode = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)intersection_index);
  local_2c = ValidationState_t::GetTypeId((ValidationState_t *)inst_local,intersection_opcode);
  local_30 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,intersection_opcode);
  bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_2c);
  if (((bVar1) &&
      (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_2c),
      uVar2 == 0x20)) && (iVar3 = spvOpcodeIsConstant(local_30), iVar3 != 0)) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_intersection_id);
    this = DiagnosticStream::operator<<
                     (&local_208,
                      (char (*) [60])"expected Intersection ID to be a constant 32-bit int scalar");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateIntersectionId(ValidationState_t& _,
                                    const Instruction* inst,
                                    uint32_t intersection_index) {
  const uint32_t intersection_id =
      inst->GetOperandAs<uint32_t>(intersection_index);
  const uint32_t intersection_type = _.GetTypeId(intersection_id);
  const spv::Op intersection_opcode = _.GetIdOpcode(intersection_id);
  if (!_.IsIntScalarType(intersection_type) ||
      _.GetBitWidth(intersection_type) != 32 ||
      !spvOpcodeIsConstant(intersection_opcode)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "expected Intersection ID to be a constant 32-bit int scalar";
  }

  return SPV_SUCCESS;
}